

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner2::~Runner2(Runner2 *this)

{
  Runner2 *this_local;
  
  std::
  set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>::
  ~set(&this->m_testsAlreadyRun);
  Ptr<Catch::IReporter>::~Ptr(&this->m_reporter);
  std::ofstream::~ofstream(&this->m_ofs);
  return;
}

Assistant:

Runner2( Config& configWrapper )
        :   m_configWrapper( configWrapper ),
            m_config( configWrapper.data() )
        {
            openStream();
            makeReporter();
        }